

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t format_deserialize(void *context,void *buffer,size_t size,char *time,uint64_t id,size_t line,
                         char *func,char *file,char *level,char *message,
                         metacall_log_custom_va_list args)

{
  size_t line_local;
  uint64_t id_local;
  char *time_local;
  size_t size_local;
  void *buffer_local;
  void *context_local;
  
  return size;
}

Assistant:

static size_t format_deserialize(void *context, const void *buffer, const size_t size, const char *time, uint64_t id, size_t line, const char *func, const char *file, const char *level, const char *message, metacall_log_custom_va_list args)
{
	/* TODO */

	(void)context;
	(void)buffer;
	(void)time;
	(void)id;
	(void)line;
	(void)func;
	(void)file;
	(void)level;
	(void)message;
	(void)args;

	return size;
}